

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O0

void __thiscall kmp_taskloop_bounds_t::set_lb(kmp_taskloop_bounds_t *this,kmp_uint64 lb)

{
  kmp_uint64 *lower_1;
  kmp_uint32 *lower;
  kmp_uint64 lb_local;
  kmp_taskloop_bounds_t *this_local;
  
  if (((uint)this->taskdata->td_flags >> 0x18 & 1) == 0) {
    *(kmp_uint64 *)((long)&this->task->shareds + this->lower_offset) = lb;
  }
  else if (this->taskdata->td_size_loop_bounds == 4) {
    *(int *)this->task->shareds = (int)lb;
  }
  else {
    *(kmp_uint64 *)this->task->shareds = lb;
  }
  return;
}

Assistant:

void set_lb(kmp_uint64 lb) {
#if defined(KMP_GOMP_COMPAT)
    // Intel task just sets the lower bound normally
    if (!taskdata->td_flags.native) {
      *(kmp_uint64 *)((char *)task + lower_offset) = lb;
    } else {
      // GOMP task has to take into account the sizeof(long)
      if (taskdata->td_size_loop_bounds == 4) {
        kmp_uint32 *lower = RCAST(kmp_uint32 *, task->shareds);
        *lower = (kmp_uint32)lb;
      } else {
        kmp_uint64 *lower = RCAST(kmp_uint64 *, task->shareds);
        *lower = (kmp_uint64)lb;
      }
    }
#else
    *(kmp_uint64 *)((char *)task + lower_offset) = lb;
#endif // defined(KMP_GOMP_COMPAT)
  }